

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O0

Action __thiscall
psy::C::SyntaxDumper::visitBinaryExpression(SyntaxDumper *this,BinaryExpressionSyntax *node)

{
  undefined8 uVar1;
  SyntaxToken local_50 [56];
  BinaryExpressionSyntax *local_18;
  BinaryExpressionSyntax *node_local;
  SyntaxDumper *this_local;
  
  local_18 = node;
  node_local = (BinaryExpressionSyntax *)this;
  uVar1 = (**(code **)(*(long *)node + 0x6c8))();
  (**(code **)(*(long *)this + 0x2f0))(this,uVar1);
  (**(code **)(*(long *)local_18 + 0x6d0))();
  (**(code **)(*(long *)this + 0x2e8))(this,local_50,local_18);
  psy::C::SyntaxToken::~SyntaxToken(local_50);
  uVar1 = (**(code **)(*(long *)local_18 + 0x6d8))();
  (**(code **)(*(long *)this + 0x2f0))(this,uVar1);
  return Skip;
}

Assistant:

virtual Action visitBinaryExpression(const BinaryExpressionSyntax* node) override
    {
        nonterminal(node->left());
        terminal(node->operatorToken(), node);
        nonterminal(node->right());
        return Action::Skip;
    }